

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall
amrex::EB2::Level::fillAreaFrac(Level *this,Array<MultiFab_*,_3> *a_areafrac,Geometry *geom)

{
  undefined8 uVar1;
  FabArray<amrex::FArrayBox> *this_00;
  element_type *peVar2;
  FArrayBox *pFVar3;
  pointer ppVar4;
  pointer pIVar5;
  int i;
  int *piVar6;
  int idim_2;
  FabArray<amrex::FArrayBox> *pFVar7;
  pointer ppVar8;
  int idim;
  long lVar9;
  pointer pIVar10;
  int idim_1;
  int iVar11;
  int iVar12;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_1a0;
  Box bx;
  double local_158;
  MFIter mfi;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  lVar9 = 0;
  do {
    pFVar7 = &a_areafrac->_M_elems[lVar9]->super_FabArray<amrex::FArrayBox>;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (pFVar7,1.0,0,(pFVar7->super_FabArrayBase).n_comp,&(pFVar7->super_FabArrayBase).n_grow
              );
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (this->m_allregular == false) {
    pFVar7 = (FabArray<amrex::FArrayBox> *)&this->m_areafrac;
    lVar9 = 0;
    do {
      this_00 = &a_areafrac->_M_elems[lVar9]->super_FabArray<amrex::FArrayBox>;
      iVar11 = (this_00->super_FabArrayBase).n_grow.vect[0];
      iVar12 = (this_00->super_FabArrayBase).n_comp;
      local_b0._0_12_ = Geometry::periodicity(geom);
      mfi._0_12_ = ZEXT812(0);
      local_f0.p._0_4_ = iVar11;
      local_f0.p._4_4_ = iVar11;
      local_f0.jstride._0_4_ = iVar11;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (this_00,pFVar7,0,0,iVar12,(IntVect *)&mfi,(IntVect *)&local_f0,
                 (Periodicity *)&local_b0,COPY,(CPC *)0x0,false);
      lVar9 = lVar9 + 1;
      pFVar7 = pFVar7 + 1;
    } while (lVar9 != 3);
    mfi._0_12_ = Geometry::periodicity(geom);
    Periodicity::shiftIntVect(&local_1a0,(Periodicity *)&mfi);
    peVar2 = (this->m_covered_grids).m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        *(pointer *)
         ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MFIter::MFIter(&mfi,(FabArrayBase *)a_areafrac->_M_elems[0],'\0');
      if (mfi.currentIndex < mfi.endIndex) {
        do {
          piVar6 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + mfi.currentIndex;
          }
          pFVar7 = &a_areafrac->_M_elems[0]->super_FabArray<amrex::FArrayBox>;
          pFVar3 = (pFVar7->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar6];
          bx.smallend.vect._0_8_ =
               *(undefined8 *)(pFVar3->super_BaseFab<double>).domain.smallend.vect;
          uVar1 = *(undefined8 *)((long)&(pFVar3->super_BaseFab<double>).domain.smallend + 8);
          bx.bigend.vect[1] =
               (int)((ulong)*(undefined8 *)(pFVar3->super_BaseFab<double>).domain.bigend.vect >>
                    0x20);
          bx._20_8_ = *(undefined8 *)((long)&(pFVar3->super_BaseFab<double>).domain.bigend + 8);
          bx.smallend.vect[2] = (int)uVar1;
          bx.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
          lVar9 = 0;
          do {
            if ((bx.btype.itype >> ((uint)lVar9 & 0x1f) & 1) != 0) {
              piVar6 = bx.bigend.vect + lVar9;
              *piVar6 = *piVar6 + -1;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          bx._20_8_ = bx._20_8_ & 0xffffffff;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,pFVar7,&mfi);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_b0,&a_areafrac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_70,&a_areafrac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
          pIVar5 = local_1a0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pIVar10 = local_1a0.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_start; pIVar10 != pIVar5; pIVar10 = pIVar10 + 1
              ) {
            r.bigend.vect[2] = bx.bigend.vect[2];
            r.btype.itype = bx.btype.itype;
            r.smallend.vect[0] = bx.smallend.vect[0] + (int)*(undefined8 *)pIVar10->vect;
            r.smallend.vect[1] =
                 bx.smallend.vect[1] + (int)((ulong)*(undefined8 *)pIVar10->vect >> 0x20);
            r.smallend.vect[2] = bx.smallend.vect[2] + pIVar10->vect[2];
            r.bigend.vect[0] = bx.bigend.vect[0] + pIVar10->vect[0];
            r.bigend.vect[1] = bx.bigend.vect[1] + pIVar10->vect[1];
            r.bigend.vect[2] = r.bigend.vect[2] + pIVar10->vect[2];
            BoxArray::intersections(&this->m_covered_grids,&r,&isects);
            ppVar4 = isects.
                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar8 = isects.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar4;
                ppVar8 = ppVar8 + 1) {
              lVar9 = 0;
              do {
                r.btype.itype = (ppVar8->second).btype.itype;
                uVar1 = *(undefined8 *)((ppVar8->second).bigend.vect + 1);
                iVar11 = (int)*(undefined8 *)(pIVar10->vect + 1);
                iVar12 = (int)((ulong)*(undefined8 *)(pIVar10->vect + 1) >> 0x20);
                r.smallend.vect[2] = (ppVar8->second).smallend.vect[2] - iVar12;
                r.smallend.vect[1] = (ppVar8->second).smallend.vect[1] - iVar11;
                r.smallend.vect[0] = (ppVar8->second).smallend.vect[0] - pIVar10->vect[0];
                r.bigend.vect[0] = (ppVar8->second).bigend.vect[0] - pIVar10->vect[0];
                r.bigend.vect[1] = (int)uVar1 - iVar11;
                r.bigend.vect[2] = (int)((ulong)uVar1 >> 0x20) - iVar12;
                if ((r.btype.itype >> ((uint)lVar9 & 0x1f) & 1) == 0) {
                  piVar6 = r.bigend.vect + lVar9;
                  *piVar6 = *piVar6 + 1;
                  r.btype.itype = r.btype.itype | 1 << ((byte)lVar9 & 0x1f);
                }
                piVar6 = &mfi.currentIndex;
                if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                  piVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + mfi.currentIndex;
                }
                local_158 = 0.0;
                BaseFab<double>::setVal<(amrex::RunOn)1>
                          (&(a_areafrac->_M_elems[lVar9]->super_FabArray<amrex::FArrayBox>).m_fabs_v
                            .
                            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar6]->
                            super_BaseFab<double>,&local_158,&r,(DestComp)0x0,(NumComps)0x1);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
            }
          }
          MFIter::operator++(&mfi);
        } while (mfi.currentIndex < mfi.endIndex);
      }
      MFIter::~MFIter(&mfi);
      if (isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(isects.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_1a0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
Level::fillAreaFrac (Array<MultiFab*,AMREX_SPACEDIM> const& a_areafrac, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_areafrac[idim]->setVal(1.0);
    }

    if (isAllRegular()) return;

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        auto& areafrac = *a_areafrac[idim];
        areafrac.ParallelCopy(m_areafrac[idim],0,0,areafrac.nComp(),
                              0,areafrac.nGrow(),geom.periodicity());
    }

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(*a_areafrac[0]); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = amrex::enclosedCells((*a_areafrac[0])[mfi].box());
            AMREX_D_TERM(auto const& apx = a_areafrac[0]->array(mfi);,
                         auto const& apy = a_areafrac[1]->array(mfi);,
                         auto const& apz = a_areafrac[2]->array(mfi););
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    if (Gpu::inLaunchRegion()) {
                        const Box& bx = is.second-iv;
                        AMREX_D_TERM(const Box& xbx = amrex::surroundingNodes(bx,0);,
                                     const Box& ybx = amrex::surroundingNodes(bx,1);,
                                     const Box& zbx = amrex::surroundingNodes(bx,2););
                        amrex::ParallelFor(AMREX_D_DECL(xbx,ybx,zbx),
                          [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apx(i,j,k) = 0.0;
                          }
#if (AMREX_SPACEDIM >= 2)
                        , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apy(i,j,k) = 0.0;
                          }
#if (AMREX_SPACEDIM == 3)
                        , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apz(i,j,k) = 0.0;
                          }
#endif
#endif
                        );
                    } else {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            const Box& fbx = amrex::surroundingNodes(is.second-iv,idim);
                            (*a_areafrac[idim])[mfi].setVal<RunOn::Host>(0.0, fbx, 0, 1);
                        }
                    }
                }
            }
        }
    }
}